

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

void ImPlot::BustItemCache(void)

{
  ImPlotPlot *pIVar1;
  ImPlotContext *pIVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  
  pIVar2 = GImPlot;
  iVar4 = (GImPlot->Plots).Buf.Size;
  if (iVar4 == (GImPlot->Plots).Map.Data.Size) {
    lVar5 = -1;
    lVar3 = 0x210;
    do {
      lVar5 = lVar5 + 1;
      if (iVar4 <= lVar5) {
        return;
      }
      pIVar1 = (pIVar2->Plots).Buf.Data;
      *(undefined4 *)((long)pIVar1->YAxis + lVar3 + -0xc) = 0;
      ImPool<ImPlotItem>::Clear((ImPool<ImPlotItem> *)((long)pIVar1->YAxis + lVar3 + -0x70));
      ImPlotLegendData::Reset((ImPlotLegendData *)((long)&pIVar1->ID + lVar3));
      iVar4 = (pIVar2->Plots).Buf.Size;
      lVar3 = lVar3 + 0x2f8;
    } while (iVar4 == (pIVar2->Plots).Map.Data.Size);
  }
  __assert_fail("Buf.Size == Map.Data.Size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_internal.h"
                ,0x279,"int ImPool<ImPlotPlot>::GetBufSize() const [T = ImPlotPlot]");
}

Assistant:

void BustItemCache() {
    ImPlotContext& gp = *GImPlot;
    for (int p = 0; p < gp.Plots.GetBufSize(); ++p) {
        ImPlotPlot& plot = *gp.Plots.GetByIndex(p);
        plot.ColormapIdx = 0;
        plot.Items.Clear();
        plot.LegendData.Reset();
    }
}